

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

FMOD_RESULT
XPMP2::SoundSystemFMOD::ChnCB
          (FMOD_CHANNELCONTROL *channelcontrol,FMOD_CHANNELCONTROL_TYPE controltype,
          FMOD_CHANNELCONTROL_CALLBACK_TYPE callbacktype,void *param_4,void *param_5)

{
  uint64_t sndId;
  SoundChannel *pSVar1;
  FMOD_RESULT FVar2;
  
  FVar2 = FMOD_OK;
  if (controltype == FMOD_CHANNELCONTROL_CHANNEL && callbacktype == FMOD_CHANNELCONTROL_CALLBACK_END
     ) {
    if (me == (SoundSystem *)0x0) {
      FVar2 = FMOD_ERR_INTERNAL;
    }
    else {
      sndId = GetSndId((FMOD_CHANNEL *)channelcontrol);
      pSVar1 = SoundSystem::GetChn(me,sndId);
      if (pSVar1 != (SoundChannel *)0x0) {
        pSVar1->pChn = (FMOD_CHANNEL *)0x0;
      }
      SoundSystem::RemoveChn(me,sndId);
    }
  }
  return FVar2;
}

Assistant:

FMOD_RESULT F_CALLBACK SoundSystemFMOD::ChnCB(FMOD_CHANNELCONTROL *channelcontrol,
                                              FMOD_CHANNELCONTROL_TYPE controltype,
                                              FMOD_CHANNELCONTROL_CALLBACK_TYPE callbacktype,
                                              void *, void *)
{
    // We are only interested in "end of channel" events
    if (controltype != FMOD_CHANNELCONTROL_CHANNEL ||
        callbacktype != FMOD_CHANNELCONTROL_CALLBACK_END)
        return FMOD_OK;
    if (!me) return FMOD_ERR_INTERNAL;

    // The sound has stop, remove it from the tracking
    FMOD_CHANNEL* pFmodChn = (FMOD_CHANNEL*)channelcontrol;
    uint64_t sndId = GetSndId(pFmodChn);
    SoundChannel* pChn = me->GetChn(sndId);
    if (pChn) pChn->pChn = nullptr;                 // Sound has stopped already, no need to stop again during destruction
    me->RemoveChn(sndId);
    return FMOD_OK;
}